

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raspicam_still_test.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  ostream *this;
  long *plVar3;
  ulong uVar4;
  void *pvVar5;
  float fVar6;
  float fVar7;
  ofstream file;
  string local_290;
  string local_270;
  string local_250;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  usage();
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"-w","");
  fVar6 = getParamVal(&local_250,argc,argv,2592.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"-h","");
  fVar7 = getParamVal(&local_270,argc,argv,1944.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"-iso","");
  getParamVal(&local_290,argc,argv,400.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Initializing ...",0x10);
  this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)fVar6);
  std::__ostream_insert<char,std::char_traits<char>>(this,"x",1);
  plVar3 = (long *)std::ostream::operator<<(this,(int)fVar7);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  raspicam::RaspiCam_Still::setWidth(0x105120);
  raspicam::RaspiCam_Still::setHeight(0x105120);
  raspicam::RaspiCam_Still::setISO(0x105120);
  raspicam::RaspiCam_Still::setEncoding(0x105120);
  raspicam::RaspiCam_Still::open();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"capture",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  uVar4 = raspicam::RaspiCam_Still::getImageBufferSize();
  pvVar5 = operator_new__(uVar4 & 0xffffffff);
  cVar1 = raspicam::RaspiCam_Still::grab_retrieve((uchar *)&Camera,(uint)pvVar5);
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in grab",0xd);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    iVar2 = -1;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"saving picture.bmp",0x12);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    std::ofstream::ofstream(&local_230,"picture.bmp",_S_bin);
    std::ostream::write((char *)&local_230,(long)pvVar5);
    local_230 = _VTT;
    *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(local_138);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int main ( int argc, char *argv[] ) {
    usage();

    int width = getParamVal ( "-w",argc,argv,2592 );
    int height =getParamVal ( "-h",argc,argv,1944 );
    int iso=getParamVal ( "-iso",argc,argv,400);


    cout << "Initializing ..."<<width<<"x"<<height<<endl;
    Camera.setWidth ( width );
    Camera.setHeight ( height );
    Camera.setISO(iso);
    Camera.setEncoding ( raspicam::RASPICAM_ENCODING_BMP );
    Camera.open();
    cout<<"capture"<<endl;
    unsigned int length = Camera.getImageBufferSize(); // Header + Image Data + Padding
    unsigned char * data = new unsigned char[length];
      if ( !Camera.grab_retrieve(data, length) ) {
        cerr<<"Error in grab"<<endl;
        return -1;
    }

    cout<<"saving picture.bmp"<<endl;
    ofstream file ( "picture.bmp",ios::binary );
    file.write ( ( char* ) data,   length );
    return 0;
}